

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_create_flags2
          (Impl *this,Value *state,VkPipelineCreateFlags2CreateInfoKHR **flags2)

{
  VkPipelineCreateFlags2CreateInfoKHR *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkPipelineCreateFlags2CreateInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x18,0x10);
  if (pVVar1 != (VkPipelineCreateFlags2CreateInfoKHR *)0x0) {
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
    pVVar1->flags = 0;
  }
  *flags2 = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x100000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->flags = (VkPipelineCreateFlags2)(pGVar2->data_).n;
    return true;
  }
  __assert_fail("data_.f.flags & kUint64Flag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x71b,
                "uint64_t rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint64() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_create_flags2(const Value &state,
                                                       VkPipelineCreateFlags2CreateInfoKHR **flags2)
{
	auto *info = allocator.allocate_cleared<VkPipelineCreateFlags2CreateInfoKHR>();
	*flags2 = info;
	info->flags = state["flags"].GetUint64();
	return true;
}